

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_word.c
# Opt level: O1

int BN_sub_word(BIGNUM *a,ulong w)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong *puVar4;
  ulong uVar5;
  
  iVar2 = 1;
  if (w != 0) {
    iVar1 = BN_is_zero((BIGNUM *)a);
    if (iVar1 == 0) {
      if (a->neg == 0) {
        iVar1 = a->top;
        if (iVar1 == 1) {
          puVar4 = a->d;
          if (*puVar4 <= w && w - *puVar4 != 0) {
            *puVar4 = w - *puVar4;
            a->neg = 1;
            return 1;
          }
        }
        puVar4 = a->d;
        uVar5 = *puVar4;
        iVar3 = 0;
        if (uVar5 < w) {
          iVar3 = 0;
          do {
            *puVar4 = uVar5 - w;
            uVar5 = puVar4[1];
            puVar4 = puVar4 + 1;
            iVar3 = iVar3 + 1;
            w = 1;
          } while (uVar5 == 0);
        }
        *puVar4 = uVar5 - w;
        if ((uVar5 - w == 0) && (iVar1 = iVar1 + -1, iVar3 == iVar1)) {
          a->top = iVar1;
        }
      }
      else {
        a->neg = 0;
        iVar2 = BN_add_word(a,w);
        a->neg = 1;
      }
    }
    else {
      iVar2 = BN_set_word(a,w);
      if (iVar2 != 0) {
        BN_set_negative(a,1);
      }
    }
  }
  return iVar2;
}

Assistant:

int BN_sub_word(BIGNUM *a, BN_ULONG w)
{
    int i;

    bn_check_top(a);
    w &= BN_MASK2;

    /* degenerate case: w is zero */
    if (!w)
        return 1;
    /* degenerate case: a is zero */
    if (BN_is_zero(a)) {
        i = BN_set_word(a, w);
        if (i != 0)
            BN_set_negative(a, 1);
        return i;
    }
    /* handle 'a' when negative */
    if (a->neg) {
        a->neg = 0;
        i = BN_add_word(a, w);
        a->neg = 1;
        return (i);
    }

    if ((a->top == 1) && (a->d[0] < w)) {
        a->d[0] = w - a->d[0];
        a->neg = 1;
        return (1);
    }
    i = 0;
    for (;;) {
        if (a->d[i] >= w) {
            a->d[i] -= w;
            break;
        } else {
            a->d[i] = (a->d[i] - w) & BN_MASK2;
            i++;
            w = 1;
        }
    }
    if ((a->d[i] == 0) && (i == (a->top - 1)))
        a->top--;
    bn_check_top(a);
    return (1);
}